

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-input.cpp
# Opt level: O0

bool Game::Input::check_input_vim(char c,intendedmove_t *intendedmove)

{
  int iVar1;
  reference pvVar2;
  intendedmove_t *intendedmove_local;
  char c_local;
  
  iVar1 = toupper((int)c);
  switch(iVar1) {
  case 0x48:
    pvVar2 = std::array<bool,_4UL>::operator[](intendedmove,0);
    *pvVar2 = true;
    intendedmove_local._7_1_ = false;
    break;
  default:
    intendedmove_local._7_1_ = true;
    break;
  case 0x4a:
    pvVar2 = std::array<bool,_4UL>::operator[](intendedmove,3);
    *pvVar2 = true;
    intendedmove_local._7_1_ = false;
    break;
  case 0x4b:
    pvVar2 = std::array<bool,_4UL>::operator[](intendedmove,2);
    *pvVar2 = true;
    intendedmove_local._7_1_ = false;
    break;
  case 0x4c:
    pvVar2 = std::array<bool,_4UL>::operator[](intendedmove,1);
    *pvVar2 = true;
    intendedmove_local._7_1_ = false;
  }
  return intendedmove_local._7_1_;
}

Assistant:

bool check_input_vim(char c, intendedmove_t &intendedmove) {
  using namespace Keypress::Code;
  switch (toupper(c)) {
  case CODE_VIM_UP:
    intendedmove[FLAG_MOVE_UP] = true;
    return false;
  case CODE_VIM_LEFT:
    intendedmove[FLAG_MOVE_LEFT] = true;
    return false;
  case CODE_VIM_DOWN:
    intendedmove[FLAG_MOVE_DOWN] = true;
    return false;
  case CODE_VIM_RIGHT:
    intendedmove[FLAG_MOVE_RIGHT] = true;
    return false;
  }
  return true;
}